

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

bool gl4cts::anon_unknown_0::ImageLoadStoreMultipleUniformsTest::verifyFloatSignedNorm<short>
               (GLint original_value,GLint positive_value,GLint negated_value)

{
  uint local_2c;
  short negated_element;
  short positive_element;
  GLuint i;
  short *negated_elements;
  short *positive_elements;
  GLint negated_value_local;
  GLint positive_value_local;
  GLint original_value_local;
  
  if (original_value == positive_value) {
    for (local_2c = 0; local_2c < 2; local_2c = local_2c + 1) {
      if ((int)*(short *)((long)&positive_elements + (ulong)local_2c * 2 + 4) !=
          -(int)*(short *)((long)&positive_elements + (ulong)local_2c * 2)) {
        return false;
      }
    }
    positive_value_local._3_1_ = true;
  }
  else {
    positive_value_local._3_1_ = false;
  }
  return positive_value_local._3_1_;
}

Assistant:

static bool verifyFloatSignedNorm(GLint original_value, GLint positive_value, GLint negated_value)
	{
		if (original_value != positive_value)
		{
			return false;
		}

		static const GLuint n_elements = sizeof(GLint) / sizeof(T); /* 1, 2, 4 */

		const T* positive_elements = (T*)&positive_value;
		const T* negated_elements  = (T*)&negated_value;

		for (GLuint i = 0; i < n_elements; ++i)
		{
			const T positive_element = positive_elements[i];
			const T negated_element  = negated_elements[i];

			/* Compare data bits */
			if (positive_element != -negated_element)
			{
				return false;
			}
		}

		return true;
	}